

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O1

double reduce(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *mtrx,double ss)

{
  double dVar1;
  pointer pvVar2;
  pointer pvVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  iterator iVar7;
  double *pdVar8;
  pointer pdVar9;
  long lVar10;
  pointer pvVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  vector<double,_std::allocator<double>_> vec_help;
  vector<double,_std::allocator<double>_> vec_help1;
  vector<double,_std::allocator<double>_> vec2;
  vector<double,_std::allocator<double>_> vec1;
  vector<double,_std::allocator<double>_> local_c8;
  double *local_a8;
  iterator iStack_a0;
  double *local_98;
  double *local_88;
  iterator iStack_80;
  double *local_78;
  double *local_68;
  iterator iStack_60;
  double *local_58;
  double local_48;
  double local_40;
  double local_38;
  
  local_68 = (double *)0x0;
  iStack_60._M_current = (double *)0x0;
  local_58 = (double *)0x0;
  local_78 = (double *)0x0;
  local_88 = (double *)0x0;
  iStack_80._M_current = (double *)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_98 = (double *)0x0;
  local_a8 = (double *)0x0;
  iStack_a0._M_current = (double *)0x0;
  pvVar3 = (mtrx->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_40 = ss;
  if ((mtrx->
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pvVar3) {
    uVar14 = 0;
  }
  else {
    uVar12 = 0;
    do {
      pvVar3 = (mtrx->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pdVar9 = pvVar3[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar3[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8) != pdVar9) {
        lVar13 = 0;
        uVar14 = 0;
        do {
          if (iStack_a0._M_current == local_98) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_a8,iStack_a0,
                       (double *)((long)pdVar9 + lVar13));
          }
          else {
            *iStack_a0._M_current = *(double *)((long)pdVar9 + lVar13);
            iStack_a0._M_current = iStack_a0._M_current + 1;
          }
          uVar14 = uVar14 + 1;
          pvVar3 = (mtrx->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pdVar9 = pvVar3[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar13 = lVar13 + 8;
        } while (uVar14 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar3[uVar12].
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  (long)pdVar9 >> 3));
      }
      lVar13 = (long)iStack_a0._M_current - (long)local_a8 >> 5;
      pdVar8 = local_a8;
      if (0 < lVar13) {
        pdVar8 = (double *)
                 (((long)iStack_a0._M_current - (long)local_a8 & 0xffffffffffffffe0U) +
                 (long)local_a8);
        lVar13 = lVar13 + 1;
        iVar7._M_current = local_a8 + 2;
        do {
          if (NAN(iVar7._M_current[-2])) {
            iVar7._M_current = iVar7._M_current + -2;
            goto LAB_00102352;
          }
          if (NAN(iVar7._M_current[-1])) {
            iVar7._M_current = iVar7._M_current + -1;
            goto LAB_00102352;
          }
          if (NAN(*iVar7._M_current)) goto LAB_00102352;
          if (NAN(iVar7._M_current[1])) {
            iVar7._M_current = iVar7._M_current + 1;
            goto LAB_00102352;
          }
          lVar13 = lVar13 + -1;
          iVar7._M_current = iVar7._M_current + 4;
        } while (1 < lVar13);
      }
      lVar13 = (long)iStack_a0._M_current - (long)pdVar8 >> 3;
      if (lVar13 == 1) {
LAB_00102330:
        iVar7._M_current = pdVar8;
        if (!NAN(*pdVar8)) {
          iVar7._M_current = iStack_a0._M_current;
        }
      }
      else {
        iVar7._M_current = pdVar8;
        if (lVar13 == 2) {
LAB_0010231e:
          if (!NAN(*iVar7._M_current)) {
            pdVar8 = iVar7._M_current + 1;
            goto LAB_00102330;
          }
        }
        else {
          iVar7._M_current = iStack_a0._M_current;
          if ((lVar13 == 3) && (iVar7._M_current = pdVar8, !NAN(*pdVar8))) {
            iVar7._M_current = pdVar8 + 1;
            goto LAB_0010231e;
          }
        }
      }
LAB_00102352:
      pdVar8 = iVar7._M_current + 1;
      if (pdVar8 != iStack_a0._M_current && iVar7._M_current != iStack_a0._M_current) {
        do {
          if (!NAN(*pdVar8)) {
            *iVar7._M_current = *pdVar8;
            iVar7._M_current = iVar7._M_current + 1;
          }
          pdVar8 = pdVar8 + 1;
        } while (pdVar8 != iStack_a0._M_current);
      }
      if ((iVar7._M_current != iStack_a0._M_current) && (iStack_a0._M_current != iVar7._M_current))
      {
        iStack_a0._M_current = iVar7._M_current;
      }
      pdVar5 = local_a8 + 1;
      pdVar8 = local_a8;
      pdVar4 = local_a8;
      if (pdVar5 != iStack_a0._M_current && local_a8 != iStack_a0._M_current) {
        do {
          pdVar8 = pdVar5;
          if (*pdVar4 < *pdVar5 || *pdVar4 == *pdVar5) {
            pdVar8 = pdVar4;
          }
          pdVar5 = pdVar5 + 1;
          pdVar4 = pdVar8;
        } while (pdVar5 != iStack_a0._M_current);
      }
      if (iStack_60._M_current == local_58) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_68,iStack_60,pdVar8);
      }
      else {
        *iStack_60._M_current = *pdVar8;
        iStack_60._M_current = iStack_60._M_current + 1;
      }
      if (iStack_a0._M_current != local_a8) {
        iStack_a0._M_current = local_a8;
      }
      uVar12 = uVar12 + 1;
      pvVar3 = (mtrx->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((long)(mtrx->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
               -0x5555555555555555;
    } while (uVar12 <= uVar14 && uVar14 - uVar12 != 0);
  }
  if (uVar14 != 0) {
    uVar12 = 0;
    do {
      pdVar9 = pvVar3[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar13 = (long)pvVar3[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar9;
      if (lVar13 != 0) {
        lVar13 = lVar13 >> 3;
        lVar10 = 0;
        do {
          pdVar9[lVar10] = pdVar9[lVar10] - local_68[uVar12];
          lVar10 = lVar10 + 1;
        } while (lVar13 + (ulong)(lVar13 == 0) != lVar10);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar14);
  }
  pvVar3 = (mtrx->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish ==
      (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar14 = 0;
  }
  else {
    uVar12 = 0;
    do {
      pvVar3 = (mtrx->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((mtrx->
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish != pvVar3) {
        lVar13 = 0;
        uVar14 = 0;
        do {
          lVar10 = *(long *)((long)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_start + lVar13);
          dVar1 = *(double *)(lVar10 + uVar12 * 8);
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = dVar1;
              goto LAB_0010250e;
            }
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,(double *)(lVar10 + uVar12 * 8));
          }
          else {
            local_38 = 0.0;
            if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        (&local_c8,
                         (iterator)
                         local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_38);
            }
            else {
              *local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish = 0.0;
LAB_0010250e:
              local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar14 = uVar14 + 1;
          pvVar3 = (mtrx->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar6 = ((long)(mtrx->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                  -0x5555555555555555;
          lVar13 = lVar13 + 0x18;
        } while (uVar14 <= uVar6 && uVar6 - uVar14 != 0);
      }
      lVar13 = (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 5;
      pdVar9 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < lVar13) {
        pdVar9 = (pointer)(((long)local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffffe0U) +
                          (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        lVar13 = lVar13 + 1;
        pdVar8 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 2;
        do {
          if (NAN(pdVar8[-2])) {
            pdVar8 = pdVar8 + -2;
            goto LAB_00102631;
          }
          if (NAN(pdVar8[-1])) {
            pdVar8 = pdVar8 + -1;
            goto LAB_00102631;
          }
          if (NAN(*pdVar8)) goto LAB_00102631;
          if (NAN(pdVar8[1])) {
            pdVar8 = pdVar8 + 1;
            goto LAB_00102631;
          }
          lVar13 = lVar13 + -1;
          pdVar8 = pdVar8 + 4;
        } while (1 < lVar13);
      }
      lVar13 = (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar9 >> 3;
      if (lVar13 == 1) {
LAB_0010260f:
        pdVar8 = pdVar9;
        if (!NAN(*pdVar9)) {
          pdVar8 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
      }
      else {
        pdVar8 = pdVar9;
        if (lVar13 == 2) {
LAB_001025fd:
          if (!NAN(*pdVar8)) {
            pdVar9 = pdVar8 + 1;
            goto LAB_0010260f;
          }
        }
        else {
          pdVar8 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if ((lVar13 == 3) && (pdVar8 = pdVar9, !NAN(*pdVar9))) {
            pdVar8 = pdVar9 + 1;
            goto LAB_001025fd;
          }
        }
      }
LAB_00102631:
      pdVar4 = pdVar8 + 1;
      if (pdVar4 != local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish &&
          pdVar8 != local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        do {
          if (!NAN(*pdVar4)) {
            *pdVar8 = *pdVar4;
            pdVar8 = pdVar8 + 1;
          }
          pdVar4 = pdVar4 + 1;
        } while (pdVar4 != local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      }
      if ((pdVar8 != local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish) &&
         (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish != pdVar8)) {
        local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = pdVar8;
      }
      pdVar4 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
      pdVar8 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pdVar4 != local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish &&
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          pdVar8 = pdVar4;
          if (*pdVar9 < *pdVar4 || *pdVar9 == *pdVar4) {
            pdVar8 = pdVar9;
          }
          pdVar4 = pdVar4 + 1;
          pdVar9 = pdVar8;
        } while (pdVar4 != local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      }
      if (iStack_80._M_current == local_78) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_88,iStack_80,pdVar8);
      }
      else {
        *iStack_80._M_current = *pdVar8;
        iStack_80._M_current = iStack_80._M_current + 1;
      }
      if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
      }
      uVar12 = uVar12 + 1;
      pvVar3 = (mtrx->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar14 = (long)(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    } while (uVar12 < uVar14);
  }
  if (uVar14 != 0) {
    pvVar2 = (mtrx->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar13 = ((long)pvVar2 - (long)pvVar3 >> 3) * -0x5555555555555555;
    uVar12 = 0;
    do {
      lVar10 = lVar13 + (ulong)(lVar13 == 0);
      pvVar11 = pvVar3;
      if (pvVar2 != pvVar3) {
        do {
          pdVar9 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar9[uVar12] = pdVar9[uVar12] - local_88[uVar12];
          pvVar11 = pvVar11 + 1;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar14);
  }
  lVar13 = (long)iStack_60._M_current - (long)local_68 >> 5;
  pdVar8 = local_68;
  if (0 < lVar13) {
    pdVar8 = (double *)
             (((long)iStack_60._M_current - (long)local_68 & 0xffffffffffffffe0U) + (long)local_68);
    lVar13 = lVar13 + 1;
    iVar7._M_current = local_68 + 2;
    do {
      if (NAN(iVar7._M_current[-2])) {
        iVar7._M_current = iVar7._M_current + -2;
        goto LAB_00102855;
      }
      if (NAN(iVar7._M_current[-1])) {
        iVar7._M_current = iVar7._M_current + -1;
        goto LAB_00102855;
      }
      if (NAN(*iVar7._M_current)) goto LAB_00102855;
      if (NAN(iVar7._M_current[1])) {
        iVar7._M_current = iVar7._M_current + 1;
        goto LAB_00102855;
      }
      lVar13 = lVar13 + -1;
      iVar7._M_current = iVar7._M_current + 4;
    } while (1 < lVar13);
  }
  lVar13 = (long)iStack_60._M_current - (long)pdVar8 >> 3;
  if (lVar13 == 1) {
LAB_00102833:
    iVar7._M_current = pdVar8;
    if (!NAN(*pdVar8)) {
      iVar7._M_current = iStack_60._M_current;
    }
  }
  else {
    iVar7._M_current = pdVar8;
    if (lVar13 == 2) {
LAB_00102821:
      if (!NAN(*iVar7._M_current)) {
        pdVar8 = iVar7._M_current + 1;
        goto LAB_00102833;
      }
    }
    else {
      iVar7._M_current = iStack_60._M_current;
      if ((lVar13 == 3) && (iVar7._M_current = pdVar8, !NAN(*pdVar8))) {
        iVar7._M_current = pdVar8 + 1;
        goto LAB_00102821;
      }
    }
  }
LAB_00102855:
  pdVar8 = iVar7._M_current + 1;
  if (pdVar8 != iStack_60._M_current && iVar7._M_current != iStack_60._M_current) {
    do {
      if (!NAN(*pdVar8)) {
        *iVar7._M_current = *pdVar8;
        iVar7._M_current = iVar7._M_current + 1;
      }
      pdVar8 = pdVar8 + 1;
    } while (pdVar8 != iStack_60._M_current);
  }
  if ((iVar7._M_current != iStack_60._M_current) && (iStack_60._M_current != iVar7._M_current)) {
    iStack_60._M_current = iVar7._M_current;
  }
  lVar13 = (long)iStack_80._M_current - (long)local_88 >> 5;
  pdVar8 = local_88;
  if (0 < lVar13) {
    pdVar8 = (double *)
             (((long)iStack_80._M_current - (long)local_88 & 0xffffffffffffffe0U) + (long)local_88);
    lVar13 = lVar13 + 1;
    iVar7._M_current = local_88 + 2;
    do {
      if (NAN(iVar7._M_current[-2])) {
        iVar7._M_current = iVar7._M_current + -2;
        goto LAB_0010297d;
      }
      if (NAN(iVar7._M_current[-1])) {
        iVar7._M_current = iVar7._M_current + -1;
        goto LAB_0010297d;
      }
      if (NAN(*iVar7._M_current)) goto LAB_0010297d;
      if (NAN(iVar7._M_current[1])) {
        iVar7._M_current = iVar7._M_current + 1;
        goto LAB_0010297d;
      }
      lVar13 = lVar13 + -1;
      iVar7._M_current = iVar7._M_current + 4;
    } while (1 < lVar13);
  }
  lVar13 = (long)iStack_80._M_current - (long)pdVar8 >> 3;
  if (lVar13 != 1) {
    iVar7._M_current = pdVar8;
    if (lVar13 != 2) {
      iVar7._M_current = iStack_80._M_current;
      if ((lVar13 != 3) || (iVar7._M_current = pdVar8, NAN(*pdVar8))) goto LAB_0010297d;
      iVar7._M_current = pdVar8 + 1;
    }
    if (NAN(*iVar7._M_current)) goto LAB_0010297d;
    pdVar8 = iVar7._M_current + 1;
  }
  iVar7._M_current = pdVar8;
  if (!NAN(*pdVar8)) {
    iVar7._M_current = iStack_80._M_current;
  }
LAB_0010297d:
  pdVar8 = iVar7._M_current + 1;
  if (pdVar8 != iStack_80._M_current && iVar7._M_current != iStack_80._M_current) {
    do {
      if (!NAN(*pdVar8)) {
        *iVar7._M_current = *pdVar8;
        iVar7._M_current = iVar7._M_current + 1;
      }
      pdVar8 = pdVar8 + 1;
    } while (pdVar8 != iStack_80._M_current);
  }
  if ((iVar7._M_current != iStack_80._M_current) && (iStack_80._M_current != iVar7._M_current)) {
    iStack_80._M_current = iVar7._M_current;
  }
  local_48 = 0.0;
  for (pdVar8 = local_68; pdVar4 = local_88, pdVar8 != iStack_60._M_current; pdVar8 = pdVar8 + 1) {
    local_48 = local_48 + *pdVar8;
  }
  for (; pdVar4 != iStack_80._M_current; pdVar4 = pdVar4 + 1) {
    local_48 = local_48 + *pdVar4;
  }
  if (local_a8 != (double *)0x0) {
    operator_delete(local_a8,(long)local_98 - (long)local_a8);
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88 != (double *)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  if (local_68 != (double *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return local_48 + local_40;
}

Assistant:

double reduce(std::vector<std::vector<double>>& mtrx, double ss){

    std::vector<double> vec1,vec2,vec_help,vec_sum,vec_help1;
    double lower_bound = 0;

    for(int i=0; i<mtrx.size();i++){
        for (int j=0; j<mtrx[i].size(); j++){
            vec_help1.push_back(mtrx[i][j]);
        }
        vec_help1.erase(std::remove_if(std::begin(vec_help1),std::end(vec_help1), [](const auto& value) {return std::isnan(value);}),std::end(vec_help1));
        vec1.push_back(*std::min_element(vec_help1.begin(),vec_help1.end()));
        vec_help1.clear();
    }


    for(int i=0; i<mtrx.size();i++){
        for(int j=0; j<mtrx[i].size();j++){
            mtrx[i][j] -= vec1[i];
        }
    }

    for(int j=0; j<mtrx[0].size();j++){
        for(int i=0; i<mtrx.size();i++){
            if (mtrx[i][j]==0) {vec_help.push_back(0); continue;}
            else{
                vec_help.push_back(mtrx[i][j]);
            }
        }
        vec_help.erase(std::remove_if(std::begin(vec_help),std::end(vec_help), [](const auto& value) {return std::isnan(value);}),std::end(vec_help));
        vec2.push_back(*std::min_element(vec_help.begin(),vec_help.end()));
        vec_help.clear();
    }


    for(int j=0; j<mtrx[0].size();j++){
        for(int i=0; i<mtrx.size();i++){
            mtrx[i][j] -= vec2[j];
        }
    }


    vec1.erase(std::remove_if(std::begin(vec1),std::end(vec1), [](const auto& value) {return std::isnan(value);}),std::end(vec1));
    vec2.erase(std::remove_if(std::begin(vec2),std::end(vec2), [](const auto& value) {return std::isnan(value);}),std::end(vec2));


     for(std::vector<double>::iterator it = vec1.begin(); it!= vec1.end(); it++){
         lower_bound += *it;
     }
     for(std::vector<double>::iterator it = vec2.begin(); it!= vec2.end(); it++){
        lower_bound += *it;
     }
    return lower_bound + ss;
}